

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peer.cpp
# Opt level: O2

void __thiscall Peer::disconnect(Peer *this,bool suppressException)

{
  Socket __fd;
  int iVar1;
  Events *this_00;
  unique_ptr<Event,_std::default_delete<Event>_> *puVar2;
  Peers *this_01;
  long *plVar3;
  int *piVar4;
  char *__rhs;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __fd = SocketResource::resource(&this->m_socket);
  iVar1 = shutdown(__fd,2);
  if (iVar1 != -1 || suppressException) {
    this->m_connected = false;
    this_00 = P2PSocket::events(this->m_master);
    puVar2 = Events::onPeerDisconnect(this_00);
    Event::trigger<Peer*>
              ((puVar2->_M_t).super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
               super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.
               super__Head_base<0UL,_Event_*,_false>._M_head_impl,this);
    this_01 = P2PSocket::peers(this->m_master);
    Peers::remove(this_01,(char *)this);
    return;
  }
  plVar3 = (long *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Failed to shutdown socket to peer ",&local_b9);
  std::operator+(&local_78,&local_98,&this->m_name);
  std::operator+(&local_58,&local_78," ");
  piVar4 = __errno_location();
  __rhs = strerror(*piVar4);
  std::operator+(&local_38,&local_58,__rhs);
  std::operator+(&local_b8,&local_38,"\n");
  *plVar3 = (long)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
    *(undefined4 *)(plVar3 + 2) = local_b8.field_2._M_allocated_capacity._0_4_;
    *(undefined4 *)((long)plVar3 + 0x14) = local_b8.field_2._M_allocated_capacity._4_4_;
    *(undefined4 *)(plVar3 + 3) = local_b8.field_2._8_4_;
    *(undefined4 *)((long)plVar3 + 0x1c) = local_b8.field_2._12_4_;
  }
  else {
    *plVar3 = (long)local_b8._M_dataplus._M_p;
    plVar3[2] = CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                         local_b8.field_2._M_allocated_capacity._0_4_);
  }
  plVar3[1] = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity._0_4_ =
       local_b8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  __cxa_throw(plVar3,&PeerException::typeinfo,PeerException::~PeerException);
}

Assistant:

void Peer::disconnect(bool suppressException)
{
    int shutdown = ::shutdown(m_socket.resource(), SHUT_RDWR);
    if (shutdown == -1 && !suppressException) {
        throw PeerException(std::string{"Failed to shutdown socket to peer "} + m_name + " " +
                            std::strerror(errno) + "\n");
    }

    // Don't call close here, it will be triggered automatically when object gets destroyed
    m_connected = false;
    this->m_master->events()->onPeerDisconnect()->trigger(this);
    this->m_master->peers()->remove(this);
}